

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

void nn_random_seed(void)

{
  __pid_t _Var1;
  uint64_t uVar2;
  
  _Var1 = getpid();
  nn_random_state = 0x1f61cc07e3239bfa;
  uVar2 = nn_clock_ms();
  nn_random_state = nn_random_state ^ uVar2 + (long)_Var1;
  return;
}

Assistant:

void nn_random_seed ()
{
    uint64_t pid;

#ifdef NN_HAVE_WINDOWS
    pid = (uint64_t) GetCurrentProcessId ();
#else
    pid = (uint64_t) getpid ();
#endif

    /*  The initial state for pseudo-random number generator is computed from
        the exact timestamp and process ID. */
    memcpy (&nn_random_state, "\xfa\x9b\x23\xe3\x07\xcc\x61\x1f", 8);
    nn_random_state ^= pid + nn_clock_ms();
}